

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall
sqlite::Connection::exec
          (Connection *this,string *sql,_func_int_void_ptr_int_char_ptr_ptr_char_ptr_ptr *callback,
          void *arg)

{
  int sqlite_error_code;
  Logic_error *this_00;
  char *err_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string err;
  
  err_msg = (char *)0x0;
  sqlite_error_code = sqlite3_exec(this->db_,(sql->_M_dataplus)._M_p,callback,arg,&err_msg);
  if ((err_msg == (char *)0x0) && (sqlite_error_code == 0)) {
    return;
  }
  std::__cxx11::string::string((string *)&err,"",(allocator *)&local_60);
  if (err_msg != (char *)0x0) {
    std::__cxx11::string::assign((char *)&err);
    sqlite3_free(err_msg);
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_60,"Error evaluating SQL: ",&err);
  Logic_error::Logic_error(this_00,&local_60,sql,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::exec(const std::string & sql, int (*callback)(void *, int, char **, char **), void * arg)
    {
        char * err_msg = nullptr;
        int status = sqlite3_exec(db_, sql.c_str(), callback, arg, &err_msg);

        if(err_msg || status != SQLITE_OK)
        {
            std::string err = "";
            if(err_msg)
            {
                err = err_msg;
                sqlite3_free(err_msg);
            }
            throw Logic_error("Error evaluating SQL: " + err, sql, status, db_);
        }
    }